

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O2

NoCopyOrMove *
inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
          (NoCopyOrMove *val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view assertion_00;
  long in_FS_OFFSET;
  string_view func_00;
  string_view file_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (val->i == 0) {
    assertion_00._M_str = "x";
    assertion_00._M_len = 1;
    func_00._M_str = "test_method";
    func_00._M_len = 0xb;
    file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    file_00._M_len = 0x5c;
    assertion_fail(file_00,(int)file,func_00,assertion_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}